

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O2

string * __thiscall
(anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  long *buf;
  __dev_t _Var11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  char *__s1;
  bool bVar15;
  undefined1 local_f0 [8];
  stat statbuf;
  scoped_array<char> local_40;
  scoped_array<char> filedata;
  FileDescriptor fd;
  int chars_scanned;
  
  iVar9 = open(*this,0);
  filedata.data_._0_4_ = iVar9;
  if (iVar9 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"file open error",(allocator<char> *)local_f0);
  }
  else {
    iVar10 = fstat(iVar9,(stat *)local_f0);
    if (iVar10 == 0) {
      buf = (long *)operator_new__(statbuf.st_rdev);
      local_40.data_ = (char *)buf;
      _Var11 = anon_unknown.dwarf_3376::ReadPersistent(iVar9,buf,statbuf.st_rdev);
      if (_Var11 == statbuf.st_rdev) {
        if (statbuf.st_rdev < 0x40) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,
                     "not enough data in profile for header + trailer",
                     (allocator<char> *)((long)&filedata.data_ + 4));
        }
        else if (*buf == 0) {
          if (buf[1] == 3) {
            if (buf[2] == 0) {
              if (buf[4] == 0) {
                pcVar14 = (char *)0x28;
                bVar15 = false;
                while (!bVar15) {
                  if ((char *)(statbuf.st_rdev - 0x18) < pcVar14) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"truncated sample header",
                               (allocator<char> *)((long)&filedata.data_ + 4));
                    goto LAB_0010abac;
                  }
                  lVar5 = *(long *)((long)(buf + 1) + (long)pcVar14);
                  lVar4 = lVar5 * 8 + 0x10;
                  if ((long)(statbuf.st_rdev - lVar4) < (long)pcVar14) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"truncated sample",
                               (allocator<char> *)((long)&filedata.data_ + 4));
                    goto LAB_0010abac;
                  }
                  plVar2 = (long *)((long)buf + (long)pcVar14);
                  lVar6 = *plVar2;
                  bVar15 = lVar5 == 1 && lVar6 == 0;
                  if (lVar5 == 1 && lVar6 == 0) {
                    if (plVar2[2] != 0) {
LAB_0010ad9b:
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,
                                 "error in sample: sample count < 1",
                                 (allocator<char> *)((long)&filedata.data_ + 4));
                      goto LAB_0010abac;
                    }
                  }
                  else {
                    if (lVar6 == 0) goto LAB_0010ad9b;
                    if (lVar5 == 0) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,"error in sample: num_pcs < 1",
                                 (allocator<char> *)((long)&filedata.data_ + 4));
                      goto LAB_0010abac;
                    }
                    uVar13 = 2;
                    while (uVar13 < lVar5 + 2U) {
                      plVar3 = plVar2 + uVar13;
                      uVar13 = uVar13 + 1;
                      if (*plVar3 == 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,"error in sample: NULL PC",
                                   (allocator<char> *)((long)&filedata.data_ + 4));
                        goto LAB_0010abac;
                      }
                    }
                  }
                  pcVar14 = pcVar14 + lVar4;
                }
                if ((long)pcVar14 < (long)statbuf.st_rdev) {
                  if (*(char *)((long)buf + (long)((int)statbuf.st_rdev + -1)) == '\n') {
                    for (; (long)pcVar14 < (long)statbuf.st_rdev;
                        pcVar14 = pcVar12 + (statbuf.__glibc_reserved[2] -
                                            ((long)buf + (long)pcVar14)) + 1) {
                      pcVar12 = strchr((char *)((long)buf + (long)pcVar14),10);
                      *pcVar12 = '\0';
                      __s1 = pcVar14 + (long)buf + -1;
                      bVar8 = 1;
                      do {
                        bVar7 = bVar8;
                        pcVar1 = __s1 + 1;
                        __s1 = __s1 + 1;
                        bVar8 = 0;
                      } while (*pcVar1 == ' ');
                      statbuf.__glibc_reserved[2] = (__syscall_slong_t)pcVar14;
                      iVar9 = strncmp(__s1,"build=",6);
                      if (iVar9 != 0) {
                        filedata.data_._4_4_ = -1;
                        __isoc99_sscanf(__s1,"%*x-%*x %*c%*c%*c%*c %*x %*x:%*x %*d %n",
                                        (undefined1 *)((long)&filedata.data_ + 4));
                        if (!(bool)(bVar7 & 0 < filedata.data_._4_4_)) {
                          filedata.data_._4_4_ = -1;
                          __isoc99_sscanf(__s1,"%*x-%*x: %n",
                                          (undefined1 *)((long)&filedata.data_ + 4));
                          if (filedata.data_._4_4_ < 1) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,
                                       "unrecognized line in text section",
                                       (allocator<char> *)((long)&filedata.data_ + 4));
                            goto LAB_0010abac;
                          }
                        }
                      }
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,"",
                               (allocator<char> *)((long)&filedata.data_ + 4));
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,
                               "profile did not end with a complete line",
                               (allocator<char> *)((long)&filedata.data_ + 4));
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,"no list of mapped objects",
                             (allocator<char> *)((long)&filedata.data_ + 4));
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,
                           "error in header: non-zero padding value",
                           (allocator<char> *)((long)&filedata.data_ + 4));
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,"error in header: non-zero format version"
                         ,(allocator<char> *)((long)&filedata.data_ + 4));
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"error in header: num_slots != 3",
                       (allocator<char> *)((long)&filedata.data_ + 4));
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"error in header: non-zero count",
                     (allocator<char> *)((long)&filedata.data_ + 4));
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"read of whole file failed",
                   (allocator<char> *)((long)&filedata.data_ + 4));
      }
LAB_0010abac:
      anon_unknown.dwarf_3376::scoped_array<char>::~scoped_array(&local_40);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"fstat error",(allocator<char> *)&local_40);
    }
  }
  anon_unknown.dwarf_3376::FileDescriptor::~FileDescriptor((FileDescriptor *)&filedata);
  return __return_storage_ptr__;
}

Assistant:

std::string ProfileDataChecker::ValidateProfile() {
  FileDescriptor fd(open(filename_.c_str(), O_RDONLY));
  if (fd.get() < 0)
    return "file open error";

  struct stat statbuf;
  if (fstat(fd.get(), &statbuf) != 0)
    return "fstat error";
  if (statbuf.st_size != static_cast<ssize_t>(statbuf.st_size))
    return "file impossibly large";
  ssize_t filesize = statbuf.st_size;

  scoped_array<char> filedata(new char[filesize]);
  if (ReadPersistent(fd.get(), filedata.get(), filesize) != filesize)
    return "read of whole file failed";

  // Must have enough data for the header and the trailer.
  if (filesize < (5 + 3) * sizeof(ProfileDataSlot))
    return "not enough data in profile for header + trailer";

  // Check the header
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[0] != 0)
    return "error in header: non-zero count";
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[1] != 3)
    return "error in header: num_slots != 3";
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[2] != 0)
    return "error in header: non-zero format version";
  // Period (slot 3) can have any value.
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[4] != 0)
    return "error in header: non-zero padding value";
  ssize_t cur_offset = 5 * sizeof(ProfileDataSlot);

  // While there are samples, skip them.  Each sample consists of
  // at least three slots.
  bool seen_trailer = false;
  while (!seen_trailer) {
    if (cur_offset > filesize - 3 * sizeof(ProfileDataSlot))
      return "truncated sample header";
    ProfileDataSlot* sample =
        reinterpret_cast<ProfileDataSlot*>(filedata.get() + cur_offset);
    ProfileDataSlot slots_this_sample = 2 + sample[1];
    ssize_t size_this_sample = slots_this_sample * sizeof(ProfileDataSlot);
    if (cur_offset > filesize - size_this_sample)
      return "truncated sample";

    if (sample[0] == 0 && sample[1] == 1 && sample[2] == 0) {
      seen_trailer = true;
    } else {
      if (sample[0] < 1)
        return "error in sample: sample count < 1";
      if (sample[1] < 1)
        return "error in sample: num_pcs < 1";
      for (int i = 2; i < slots_this_sample; i++) {
        if (sample[i] == 0)
          return "error in sample: NULL PC";
      }
    }
    cur_offset += size_this_sample;
  }

  // There must be at least one line in the (text) list of mapped objects,
  // and it must be terminated by a newline.  Note, the use of newline
  // here and below Might not be reasonable on non-UNIX systems.
  if (cur_offset >= filesize)
    return "no list of mapped objects";
  if (filedata[filesize - 1] != '\n')
    return "profile did not end with a complete line";

  while (cur_offset < filesize) {
    char* line_start = filedata.get() + cur_offset;

    // Find the end of the line, and replace it with a NUL for easier
    // scanning.
    char* line_end = strchr(line_start, '\n');
    *line_end = '\0';

    // Advance past any leading space.  It's allowed in some lines,
    // but not in others.
    bool has_leading_space = false;
    char* line_cur = line_start;
    while (*line_cur == ' ') {
      has_leading_space = true;
      line_cur++;
    }

    bool found_match = false;

    // Check for build lines.
    if (!found_match) {
      found_match = (strncmp(line_cur, "build=", 6) == 0);
      // Anything may follow "build=", and leading space is allowed.
    }

    // A line from ProcMapsIterator::FormatLine, of the form:
    //
    // 40000000-40015000 r-xp 00000000 03:01 12845071   /lib/ld-2.3.2.so
    //
    // Leading space is not allowed.  The filename may be omitted or
    // may consist of multiple words, so we scan only up to the
    // space before the filename.
    if (!found_match) {
      int chars_scanned = -1;
      sscanf(line_cur, "%*x-%*x %*c%*c%*c%*c %*x %*x:%*x %*d %n",
             &chars_scanned);
      found_match = (chars_scanned > 0 && !has_leading_space);
    }

    // A line from DumpAddressMap, of the form:
    //
    // 40000000-40015000: /lib/ld-2.3.2.so
    //
    // Leading space is allowed.  The filename may be omitted or may
    // consist of multiple words, so we scan only up to the space
    // before the filename.
    if (!found_match) {
      int chars_scanned = -1;
      sscanf(line_cur, "%*x-%*x: %n", &chars_scanned);
      found_match = (chars_scanned > 0);
    }

    if (!found_match)
      return "unrecognized line in text section";

    cur_offset += (line_end - line_start) + 1;
  }

  return kNoError;
}